

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

void start_element_handler(void *data,char *el,char **attr)

{
  coda_format format;
  hashtable *table;
  uint uVar1;
  int iVar2;
  coda_dynamic_type *in_RAX;
  long lVar3;
  char *pcVar4;
  coda_mem_array *pcVar5;
  coda_type_array *pcVar6;
  coda_mem_record *pcVar7;
  coda_type_record *pcVar8;
  coda_dynamic_type *pcVar9;
  coda_xml_product *product;
  char *pcVar10;
  coda_type_array *definition;
  ulong index;
  long lVar11;
  coda_mem_record *parent;
  coda_dynamic_type *local_38;
  
  iVar2 = *(int *)((long)data + 0x18);
  lVar3 = (long)iVar2;
  pcVar9 = *(coda_dynamic_type **)((long)data + lVar3 * 8 + 0x120);
  local_38 = in_RAX;
  if (pcVar9 == (coda_dynamic_type *)0x0) {
    pcVar4 = *(char **)((long)data + lVar3 * 8 + 800);
    pcVar10 = "mixed content for element \'%s\' is not supported";
LAB_0016794e:
    coda_set_error(-300,pcVar10,pcVar4);
    goto LAB_0016797d;
  }
  format = pcVar9->definition->format;
  if (format != coda_format_xml) {
    el = *(char **)((long)data + lVar3 * 8 + 800);
    pcVar4 = coda_type_get_format_name(format);
    pcVar10 = "xml element \'%s\' not allowed inside %s data";
LAB_00167976:
    coda_set_error(-300,pcVar10,el,pcVar4);
    goto LAB_0016797d;
  }
  *(undefined8 *)((long)data + 0x430) = 0;
  if (0x1e < iVar2) {
    coda_set_error(-300,"xml file exceeds maximum supported hierarchical depth (%d)",0x20);
    goto LAB_0016797d;
  }
  *(int *)((long)data + 0x18) = iVar2 + 1;
  *(undefined8 *)((long)data + lVar3 * 8 + 0x128) = 0;
  local_38 = pcVar9;
  lVar3 = coda_hashtable_get_index_from_name(*(hashtable **)&pcVar9->definition[1].type_class,el);
  uVar1 = (uint)lVar3;
  if ((int)uVar1 < 0) {
    table = *(hashtable **)&pcVar9->definition[1].type_class;
    pcVar4 = coda_element_name_from_xml_name(el);
    lVar3 = coda_hashtable_get_index_from_name(table,pcVar4);
    uVar1 = (uint)lVar3;
    if ((int)uVar1 < 0) {
      if (*(int *)((long)data + 0x428) == 0) {
        if ((long)*(int *)((long)data + 0x18) == 1) {
          pcVar10 = "xml element \'%s\' is not allowed as root element";
          pcVar4 = el;
          goto LAB_0016794e;
        }
        pcVar4 = *(char **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x318);
        pcVar10 = "xml element \'%s\' is not allowed within element \'%s\'";
        goto LAB_00167976;
      }
      pcVar8 = coda_type_record_new(coda_format_xml);
      if (pcVar8 == (coda_type_record *)0x0) goto LAB_0016797d;
      iVar2 = coda_type_record_create_field
                        ((coda_type_record *)pcVar9->definition,el,(coda_type *)pcVar8);
      coda_type_release((coda_type *)pcVar8);
      if ((iVar2 != 0) || (iVar2 = coda_mem_type_update(&local_38,pcVar9->definition), iVar2 != 0))
      goto LAB_0016797d;
      if (local_38 !=
          *(coda_dynamic_type **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x118)) {
        __assert_fail("parent == info->record[info->depth - 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x18b,"void start_element_handler(void *, const char *, const char **)");
      }
      lVar3 = coda_hashtable_get_index_from_name
                        (*(hashtable **)&local_38->definition[1].type_class,el);
      uVar1 = (uint)lVar3;
      pcVar9 = local_38;
      if ((int)uVar1 < 0) {
        __assert_fail("index >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x18d,"void start_element_handler(void *, const char *, const char **)");
      }
    }
  }
  index = (ulong)uVar1;
  iVar2 = *(int *)((long)data + 0x18);
  *(ulong *)((long)data + (long)iVar2 * 8 + 0x220) = index;
  *(long *)((long)data + (long)iVar2 * 8 + 0x20) =
       *(long *)(pcVar9->definition[1].description + index * 8) + 0x10;
  iVar2 = coda_type_get_record_field_real_name
                    (pcVar9->definition,index,(char **)((long)data + (long)iVar2 * 8 + 800));
  if (iVar2 != 0) goto LAB_0016797d;
  lVar3 = (long)*(int *)((long)data + 0x18);
  definition = (coda_type_array *)**(undefined8 **)((long)data + lVar3 * 8 + 0x20);
  if (definition->type_class == coda_array_class) {
    if (definition->format == coda_format_xml) {
      pcVar6 = definition;
      if (*(long *)(&(local_38[2].definition)->format + index * 2) == 0) {
        pcVar5 = coda_mem_array_new(definition,(coda_dynamic_type *)0x0);
        *(coda_mem_array **)(&(local_38[2].definition)->format + index * 2) = pcVar5;
        if (*(long *)(&(local_38[2].definition)->format + index * 2) == 0) goto LAB_0016797d;
        goto LAB_00167a8c;
      }
LAB_00167a90:
      *(coda_type ***)((long)data + lVar3 * 8 + 0x20) = &pcVar6->base_type;
      definition = (coda_type_array *)pcVar6->base_type;
    }
  }
  else if (*(long *)(&(local_38[2].definition)->format + index * 2) != 0) {
    if (*(int *)((long)data + 0x428) == 0) {
      pcVar4 = *(char **)((long)data + lVar3 * 8 + 0x318);
      pcVar10 = "xml element \'%s\' is not allowed more than once within element \'%s\'";
      goto LAB_00167976;
    }
    pcVar6 = coda_type_array_new(coda_format_xml);
    if (pcVar6 == (coda_type_array *)0x0) goto LAB_0016797d;
    iVar2 = coda_type_array_set_base_type(pcVar6,(coda_type *)definition);
    if (iVar2 != 0) {
      coda_type_release((coda_type *)pcVar6);
      goto LAB_0016797d;
    }
    **(undefined8 **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20) = pcVar6;
    coda_type_release((coda_type *)definition);
    iVar2 = coda_type_array_add_variable_dimension(pcVar6,(coda_expression *)0x0);
    if (((iVar2 != 0) ||
        (pcVar5 = coda_mem_array_new(pcVar6,(coda_dynamic_type *)0x0),
        pcVar5 == (coda_mem_array *)0x0)) ||
       (iVar2 = coda_mem_array_add_element
                          (pcVar5,*(coda_dynamic_type **)
                                   (&(local_38[2].definition)->format + index * 2)), iVar2 != 0))
    goto LAB_0016797d;
    *(coda_mem_array **)(&(local_38[2].definition)->format + index * 2) = pcVar5;
LAB_00167a8c:
    lVar3 = (long)*(int *)((long)data + 0x18);
    goto LAB_00167a90;
  }
  pcVar8 = definition->attributes;
  if (pcVar8 == (coda_type_record *)0x0) {
    *(undefined8 *)((long)data + 0x420) = 0;
    pcVar4 = *attr;
    if (*(int *)((long)data + 0x428) == 0) {
      if (pcVar4 != (char *)0x0) {
        pcVar10 = "xml attribute \'%s\' is not allowed";
        goto LAB_0016794e;
      }
    }
    else if ((pcVar4 != (char *)0x0) || (pcVar4 = coda_element_name_from_xml_name(el), pcVar4 != el)
            ) {
      pcVar8 = coda_type_record_new(coda_format_xml);
      definition->attributes = pcVar8;
      if (pcVar8 == (coda_type_record *)0x0) goto LAB_0016797d;
      product = *(coda_xml_product **)((long)data + 0x10);
      iVar2 = *(int *)((long)data + 0x428);
      goto LAB_00167ba0;
    }
  }
  else {
    product = *(coda_xml_product **)((long)data + 0x10);
    iVar2 = *(int *)((long)data + 0x428);
LAB_00167ba0:
    pcVar7 = attribute_record_new(pcVar8,product,el,attr,iVar2);
    *(coda_mem_record **)((long)data + 0x420) = pcVar7;
    if (pcVar7 == (coda_mem_record *)0x0) goto LAB_0016797d;
  }
  if (definition->format != coda_format_xml) {
    return;
  }
  if (definition->type_class != coda_record_class) {
    return;
  }
  if ((int)definition->dim[2] != 0) {
    __assert_fail("!((coda_type_record *)definition)->is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x223,"void start_element_handler(void *, const char *, const char **)");
  }
  pcVar7 = coda_mem_record_new((coda_type_record *)definition,
                               *(coda_dynamic_type **)((long)data + 0x420));
  lVar3 = (long)*(int *)((long)data + 0x18);
  *(coda_mem_record **)((long)data + lVar3 * 8 + 0x120) = pcVar7;
  if (pcVar7 != (coda_mem_record *)0x0) {
    if (0 < pcVar7->num_fields) {
      lVar11 = 0;
      do {
        pcVar6 = *(coda_type_array **)(*(long *)(definition->dim[0] + lVar11 * 8) + 0x10);
        if ((pcVar6->type_class == coda_array_class) && (pcVar6->format == coda_format_xml)) {
          pcVar5 = coda_mem_array_new(pcVar6,(coda_dynamic_type *)0x0);
          lVar3 = (long)*(int *)((long)data + 0x18);
          *(coda_mem_array **)
           (*(long *)(*(long *)((long)data + lVar3 * 8 + 0x120) + 0x28) + lVar11 * 8) = pcVar5;
          if (*(long *)(*(long *)(*(long *)((long)data + lVar3 * 8 + 0x120) + 0x28) + lVar11 * 8) ==
              0) goto LAB_0016797d;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(long *)(*(long *)((long)data + (long)(int)lVar3 * 8 + 0x120) + 0x20));
    }
    *(undefined8 *)((long)data + 0x420) = 0;
    return;
  }
LAB_0016797d:
  coda_XML_StopParser(*data,'\0');
  *(undefined4 *)((long)data + 8) = 1;
  return;
}

Assistant:

static void XMLCALL start_element_handler(void *data, const char *el, const char **attr)
{
    parser_info *info = (parser_info *)data;
    xml_element_tag tag;

    if (info->unparsed_depth > 0)
    {
        /* We are inside an element of another namespace -> ignore this element */
        info->unparsed_depth++;
        return;
    }

    tag = (xml_element_tag)hashtable_get_index_from_name(info->hash_data, el);
    if (tag < 0 && strncmp(el, CODA_DEFINITION_NAMESPACE, strlen(CODA_DEFINITION_NAMESPACE)) != 0)
    {
        /* start of a branch from some other namespace */
        info->unparsed_depth = 1;
        return;
    }
    if (tag < 0 || info->node->init_sub_element[tag] == NULL)
    {
        if (info->node->tag == no_element)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "xml element '%s' is not allowed as root element",
                           coda_element_name_from_xml_name(el));
        }
        else if (info->node->format_set)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION,
                           "xml element '%s' is not allowed within element '%s'{%s}",
                           coda_element_name_from_xml_name(el), xml_element_name(info->node->tag),
                           coda_type_get_format_name(info->node->format));
        }
        else
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "xml element '%s' is not allowed within element '%s'",
                           coda_element_name_from_xml_name(el), xml_element_name(info->node->tag));
        }
        abort_parser(info);
        return;
    }

    if (push_node(info, tag, attr) != 0)
    {
        abort_parser(info);
    }
}